

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiBroker.cpp
# Opt level: O0

shared_ptr<helics::helicsCLI11App> __thiscall helics::MultiBroker::generateCLI(MultiBroker *this)

{
  element_type *peVar1;
  element_type *this_00;
  Option *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  long in_RSI;
  element_type *in_RDI;
  shared_ptr<helics::helicsCLI11App> sVar3;
  CoreBroker *in_stack_00000048;
  bool in_stack_0000007f;
  helicsCLI11App *in_stack_00000080;
  element_type *app_p;
  App_p netApp;
  shared_ptr<helics::helicsCLI11App> *app;
  undefined1 in_stack_000014e7;
  NetworkBrokerData *in_stack_000014e8;
  string_view in_stack_000014f0;
  shared_ptr<CLI::App> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  App *this_02;
  char *in_stack_fffffffffffffea8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffeb0;
  function<void_()> *this_03;
  allocator<char> *__a;
  char *__s;
  string *name;
  element_type *this_04;
  undefined1 local_e0 [16];
  char (*in_stack_ffffffffffffff30) [1];
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  string local_68;
  allocator<char> local_38 [16];
  char local_28 [40];
  
  local_28[0x17] = '\0';
  this_04 = in_RDI;
  CoreBroker::generateCLI(in_stack_00000048);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  NetworkBrokerData::commandLineParser(in_stack_000014e8,in_stack_000014f0,(bool)in_stack_000014e7);
  __s = local_28;
  __a = local_38;
  std::shared_ptr<CLI::App>::shared_ptr<helics::helicsCLI11App,void>
            ((shared_ptr<CLI::App> *)in_stack_fffffffffffffea0,
             (shared_ptr<helics::helicsCLI11App> *)in_stack_fffffffffffffe98);
  CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
            ((shared_ptr<helics::helicsCLI11App> *)0x1f3d62);
  peVar1 = CLI::std::
           __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f3d6c);
  name = &local_68;
  CLI::std::shared_ptr<CLI::App>::shared_ptr
            ((shared_ptr<CLI::App> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  CLI::App::add_subcommand((App *)in_stack_ffffffffffffff40,(App_p *)in_stack_ffffffffffffff38);
  CLI::std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)0x1f3da6);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1f3db0);
  helicsCLI11App::addTypeOption(in_stack_00000080,in_stack_0000007f);
  this_00 = CLI::std::
            __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1f3dc9);
  helicsCLI11App::setDefaultCoreType(this_00,*(CoreType *)(in_RSI + 0xfac));
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1f3de8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)peVar1,__s,__a);
  CLI::App::add_flag<const_char[1],_(CLI::detail::enabler)0>
            ((App *)in_stack_ffffffffffffff40,(string *)in_stack_ffffffffffffff38,
             in_stack_ffffffffffffff30);
  this_03 = (function<void_()> *)&stack0xffffffffffffff4f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)peVar1,__s,__a);
  this_01 = CLI::OptionBase<CLI::Option>::group((OptionBase<CLI::Option> *)this_04,name);
  CLI::Option::force_callback(this_01,true);
  std::__cxx11::string::~string(in_stack_fffffffffffffea0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
  std::__cxx11::string::~string(in_stack_fffffffffffffea0);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  CLI::std::__shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>::get
            ((__shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2> *)this_04);
  peVar1 = CLI::std::
           __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1f3ee1);
  this_02 = (App *)local_e0;
  std::function<void()>::function<helics::MultiBroker::generateCLI()::__0,void>
            (this_03,(anon_class_16_2_f784c2bf *)this_01);
  CLI::App::final_callback(this_02,(function<void_()> *)peVar1);
  CLI::std::function<void_()>::~function((function<void_()> *)0x1f3f36);
  local_28[0x17] = 1;
  CLI::std::shared_ptr<CLI::App>::~shared_ptr((shared_ptr<CLI::App> *)0x1f3f4b);
  _Var2._M_pi = extraout_RDX;
  if ((local_28[0x17] & 1U) == 0) {
    CLI::std::shared_ptr<helics::helicsCLI11App>::~shared_ptr
              ((shared_ptr<helics::helicsCLI11App> *)0x1f407c);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar3.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> MultiBroker::generateCLI()
{
    auto app = CoreBroker::generateCLI();
    CLI::App_p netApp = netInfo.commandLineParser("127.0.0.1", false);
    app->add_subcommand(std::move(netApp));
    app->addTypeOption();
    app->setDefaultCoreType(type);
    // this is a null flag option for forcing the callback to run
    app->add_flag("-_", "")->group("")->force_callback();
    auto* app_p = app.get();
    app->final_callback([this, app_p]() {
        auto* copt = app_p->get_parent()->get_option("--config");
        if (copt->count() > 0) {
            configFile = app_p->get_parent()->get_option("--config")->as<std::string>();
        }
        type = app_p->getCoreType();
    });
    return app;
}